

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O3

int scale_image_RGB_to_NTSC_safe(uchar *orig,int width,int height,int channels)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uchar auStack_108 [8];
  uchar scale_LUT [256];
  
  iVar1 = 0;
  if ((((orig != (uchar *)0x0) && (0 < width)) && (0 < height)) && (0 < channels)) {
    lVar2 = 0;
    do {
      auStack_108[lVar2] = (uchar)(int)(((float)(int)lVar2 * 219.99799) / 255.0 + 15.501);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
    iVar4 = height * width * channels;
    iVar1 = 1;
    if (0 < iVar4) {
      uVar3 = channels - (~channels & 1U);
      lVar2 = 0;
      do {
        if (0 < (int)uVar3) {
          uVar5 = 0;
          do {
            orig[uVar5] = auStack_108[orig[uVar5]];
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        lVar2 = lVar2 + (ulong)(uint)channels;
        orig = orig + (uint)channels;
      } while ((int)lVar2 < iVar4);
    }
  }
  return iVar1;
}

Assistant:

int
	scale_image_RGB_to_NTSC_safe
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	const float scale_lo = 16.0f - 0.499f;
	const float scale_hi = 235.0f + 0.499f;
	int i, j;
	int nc = channels;
	unsigned char scale_LUT[256];
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (orig == NULL) )
	{
		/*	nothing to do	*/
		return 0;
	}
	/*	set up the scaling Look Up Table	*/
	for( i = 0; i < 256; ++i )
	{
		scale_LUT[i] = (unsigned char)((scale_hi - scale_lo) * i / 255.0f + scale_lo);
	}
	/*	for channels = 2 or 4, ignore the alpha component	*/
	nc -= 1 - (channels & 1);
	/*	OK, go through the image and scale any non-alpha components	*/
	for( i = 0; i < width*height*channels; i += channels )
	{
		for( j = 0; j < nc; ++j )
		{
			orig[i+j] = scale_LUT[orig[i+j]];
		}
	}
	return 1;
}